

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

Token * has_token_of_type(List *list,TokenType type)

{
  Token *t;
  TokenType type_local;
  List *list_local;
  
  if (list == (List *)0x0) {
    list_local = (List *)0x0;
  }
  else if ((list->token).type == type) {
    list_local = (List *)&list->token;
  }
  else {
    list_local = (List *)has_token_of_type(list->car,type);
    if ((list_local == (List *)0x0) &&
       (list_local = (List *)has_token_of_type(list->cdr,type), list_local == (List *)0x0)) {
      list_local = (List *)0x0;
    }
  }
  return (Token *)list_local;
}

Assistant:

Token *
has_token_of_type (List *list, TokenType type)
{
  Token *t;

  if (list == NULL)
    return NULL;
  if (list->token.type == type)
    return &list->token;
  t = has_token_of_type (list->car, type);
  if (t != NULL)
    return t;
  t = has_token_of_type (list->cdr, type);
  if (t != NULL)
    return t;
  return NULL;
}